

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetRepaintManager::markDirty<QRegion>
          (QWidgetRepaintManager *this,QRegion *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  QWidgetRepaintManager *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  QWidgetRepaintManager QVar3;
  QWidgetData *pQVar4;
  long lVar5;
  QWidgetPrivate *this_01;
  QRect QVar6;
  QRect QVar7;
  QRect QVar8;
  QRect QVar9;
  bool bVar10;
  char cVar11;
  byte bVar12;
  QLoggingCategory *pQVar13;
  QPoint QVar14;
  Representation RVar15;
  QRegion *this_02;
  long in_FS_OFFSET;
  QRect QVar16;
  undefined1 auVar17 [16];
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QRect local_c8;
  undefined1 local_b8 [12];
  Representation RStack_ac;
  QRect local_a8;
  QRegion local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  QDebug local_80;
  QArrayData *local_78;
  QWidgetData *pQStack_70;
  double local_68;
  double local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar13->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar13->name;
    local_58.x1.m_i = 2;
    local_58.y1.m_i = 0;
    local_58.x2.m_i = 0;
    local_58.y2.m_i = 0;
    uStack_48 = 0;
    local_44 = 0;
    QMessageLogger::info();
    uVar1 = local_c8._0_8_;
    QVar18.m_data = (storage_type *)0x7;
    QVar18.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_c8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_c8._0_8_,' ');
    }
    local_98.d = (QRegionData *)local_c8._0_8_;
    *(int *)(local_c8._0_8_ + 0x28) = *(int *)(local_c8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_b8,&local_98);
    uVar1 = local_b8._0_8_;
    QVar19.m_data = (storage_type *)0x2;
    QVar19.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_b8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_b8._0_8_,' ');
    }
    local_90 = (undefined1  [8])local_b8._0_8_;
    *(int *)(local_b8._0_8_ + 0x28) = *(int *)(local_b8._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_a8,(QWidget *)local_90);
    uVar1 = local_a8._0_8_;
    QVar20.m_data = (storage_type *)0x5;
    QVar20.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    uVar1 = local_a8._0_8_;
    QVar21.m_data = (storage_type *)0x4;
    QVar21.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)uVar1,(QString *)&local_78);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_a8._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a8._0_8_,' ');
    }
    local_88.stream = (Stream *)local_a8._0_8_;
    *(int *)(local_a8._0_8_ + 0x28) = *(int *)(local_a8._0_8_ + 0x28) + 1;
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)&local_88,(QMetaObject *)(ulong)updateTime,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug((QDebug *)&local_a8);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)local_b8);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)&local_c8);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  pQVar4 = widget->data;
  local_a8.x2.m_i = (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i;
  local_a8.y2.m_i = (pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i;
  local_a8.x1.m_i = 0;
  local_a8.y1.m_i = 0;
  bVar10 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  QVar16.x2.m_i = local_a8.x2.m_i;
  QVar16.y2.m_i = local_a8.y2.m_i;
  QVar16.x1.m_i = local_a8.x1.m_i;
  QVar16.y1.m_i = local_a8.y1.m_i;
  lVar5 = *(long *)&widget->field_0x8;
  if (bVar10) {
    cVar11 = QRegion::isEmpty();
    this_02 = (QRegion *)(*(long *)&widget->field_0x8 + 0xe0);
    if (cVar11 == '\0') {
      cVar11 = qt_region_strictContains(this_02,&local_a8);
      QVar8.x2.m_i = local_b8._8_4_;
      QVar8.y2.m_i = RStack_ac.m_i;
      QVar8.x1.m_i = local_b8._0_4_;
      QVar8.y1.m_i = local_b8._4_4_;
      QVar6.x2.m_i = local_c8.x2.m_i;
      QVar6.y2.m_i = local_c8.y2.m_i;
      QVar6.x1.m_i = local_c8.x1.m_i;
      QVar6.y1.m_i = local_c8.y1.m_i;
      if (cVar11 == '\0') {
        cVar11 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        QVar9.x2.m_i = local_b8._8_4_;
        QVar9.y2.m_i = RStack_ac.m_i;
        QVar9.x1.m_i = local_b8._0_4_;
        QVar9.y1.m_i = local_b8._4_4_;
        QVar7.x2.m_i = local_c8.x2.m_i;
        QVar7.y2.m_i = local_c8.y2.m_i;
        QVar7.x1.m_i = local_c8.x1.m_i;
        QVar7.y1.m_i = local_c8.y1.m_i;
        if ((updateTime != UpdateNow) && (local_c8 = QVar7, _local_b8 = QVar9, cVar11 == '\0'))
        goto LAB_0031edfd;
      }
      else {
        local_c8 = QVar6;
        _local_b8 = QVar8;
        if (updateTime != UpdateNow) goto LAB_0031edfd;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::operator=(this_02,r);
    }
  }
  else if ((*(uint *)(lVar5 + 0x250) >> 0x18 & 1) == 0) {
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(QGraphicsEffect **)(lVar5 + 200) != (QGraphicsEffect *)0x0) {
      bVar10 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar5 + 200));
      QVar16.x2.m_i = local_a8.x2.m_i;
      QVar16.y2.m_i = local_a8.y2.m_i;
      QVar16.x1.m_i = local_a8.x1.m_i;
      QVar16.y1.m_i = local_a8.y1.m_i;
      if (bVar10) {
        local_78 = (QArrayData *)(double)local_a8.x1.m_i;
        pQStack_70 = (QWidgetData *)(double)local_a8.y1.m_i;
        local_68 = (double)(((long)local_a8.x2.m_i - (long)local_a8.x1.m_i) + 1);
        local_60 = (double)(((long)local_a8.y2.m_i - (long)local_a8.y1.m_i) + 1);
        (**(code **)(**(long **)(lVar5 + 200) + 0x60))(&local_58);
        QVar16 = (QRect)QRectF::toAlignedRect();
      }
    }
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    _local_b8 = QVar16;
    QVar14 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_58);
    RVar15 = QVar14.xp.m_i;
    local_c8.x1.m_i = local_b8._0_4_ + RVar15.m_i;
    local_c8.x2.m_i = local_b8._8_4_ + RVar15.m_i;
    local_c8.y1.m_i = local_b8._4_4_ + QVar14.yp.m_i.m_i;
    local_c8.y2.m_i = RStack_ac.m_i + QVar14.yp.m_i.m_i;
    local_58.x1.m_i = 0;
    local_58.y1.m_i = 0;
    uVar1 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x1c);
    uVar2 = *(undefined8 *)(*(long *)(*(long *)this + 0x20) + 0x14);
    local_58.x2.m_i = (int)uVar1 - (int)uVar2;
    local_58.y2.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
    local_c8 = (QRect)QRect::operator&(&local_c8,&local_58);
    this_00 = this + 0x10;
    cVar11 = qt_region_strictContains((QRegion *)this_00,&local_c8);
    if (cVar11 == '\0') {
      if (bufferState == BufferInvalid) {
        bVar12 = QRegion::isEmpty();
        QVar3 = this[0x88];
        lVar5 = *(long *)&widget->field_0x8;
        if (*(long *)(lVar5 + 200) == 0) {
          QRegion::translated((int)&local_58,(int)r);
          QRegion::operator+=((QRegion *)this_00,(QRegion *)&local_58);
          QRegion::~QRegion((QRegion *)&local_58);
        }
        else {
          auVar17 = QRegion::boundingRect();
          if (*(QGraphicsEffect **)(lVar5 + 200) != (QGraphicsEffect *)0x0) {
            bVar10 = QGraphicsEffect::isEnabled(*(QGraphicsEffect **)(lVar5 + 200));
            if (bVar10) {
              local_78 = (QArrayData *)(double)auVar17._0_4_;
              pQStack_70 = (QWidgetData *)(double)auVar17._4_4_;
              local_68 = (double)(((long)auVar17._8_4_ - (long)auVar17._0_4_) + 1);
              local_60 = (double)(((auVar17._8_8_ >> 0x20) - (auVar17._0_8_ >> 0x20)) + 1);
              (**(code **)(**(long **)(lVar5 + 200) + 0x60))(&local_58);
              auVar17 = QRectF::toAlignedRect();
            }
          }
          local_58.x1.m_i = RVar15.m_i + auVar17._0_4_;
          local_58.x2.m_i = auVar17._8_4_ + RVar15.m_i;
          local_58.y1.m_i = (int)(auVar17._0_8_ + ((ulong)QVar14 & 0xffffffff00000000) >> 0x20);
          local_58.y2.m_i = (int)(((ulong)QVar14 & 0xffffffff00000000) + auVar17._8_8_ >> 0x20);
          QRegion::operator+=((QRegion *)this_00,&local_58);
        }
        if (updateTime != UpdateNow && (((byte)QVar3 ^ 1) & bVar12) == 0) goto LAB_0031edfd;
      }
      else if (*(long *)(this + 0x28) == 0) {
        addDirtyWidget(this,widget,r);
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
          addDirtyWidget(this,widget,r);
        }
        else {
          cVar11 = qt_region_strictContains
                             ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),(QRect *)local_b8);
          if (cVar11 == '\0') {
            this_01 = *(QWidgetPrivate **)&widget->field_0x8;
            if (this_01->graphicsEffect == (QGraphicsEffect *)0x0) {
              QRegion::operator+=(&this_01->dirty,r);
            }
            else {
              QVar16 = QWidgetPrivate::effectiveRectFor(this_01,r);
              local_58.x1 = QVar16.x1.m_i;
              local_58.y1 = QVar16.y1.m_i;
              local_58.x2 = QVar16.x2.m_i;
              local_58.y2 = QVar16.y2.m_i;
              QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_58);
            }
          }
        }
        if (updateTime != UpdateNow) goto LAB_0031edfd;
        updateTime = UpdateNow;
      }
    }
    else {
      bVar10 = updateTime != UpdateNow;
      updateTime = UpdateNow;
      if (bVar10) goto LAB_0031edfd;
    }
    widget = *(QWidget **)this;
  }
  else {
    if ((*(uint *)(lVar5 + 0x250) >> 0x13 & 1) == 0) {
      addDirtyRenderToTextureWidget(this,widget);
    }
    if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0)) goto LAB_0031edfd;
    widget = *(QWidget **)this;
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_0031edfd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}